

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Watcher.hpp
# Opt level: O2

void __thiscall efsw::Watcher::~Watcher(Watcher *this)

{
  this->_vptr_Watcher = (_func_int **)&PTR__Watcher_0011dc98;
  std::__cxx11::string::~string((string *)&this->OldFileName);
  std::__cxx11::string::~string((string *)&this->Directory);
  return;
}

Assistant:

virtual ~Watcher() {}